

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O3

void __thiscall AsyncRgbLedAnalyzerSettings::InitControllerData(AsyncRgbLedAnalyzerSettings *this)

{
  long lVar1;
  undefined1 *puVar2;
  undefined1 *local_9b0 [2];
  undefined1 local_9a0 [16];
  undefined1 *local_990 [2];
  undefined1 local_980 [16];
  undefined2 local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined1 local_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 local_888;
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  undefined2 local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined4 local_758;
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  undefined2 local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined1 local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined4 local_628;
  undefined1 *local_620 [2];
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined2 local_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined1 local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined4 local_508;
  undefined4 uStack_504;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined4 local_4f8;
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [16];
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  undefined2 local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined1 local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined4 local_3c8;
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined2 local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 local_298;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined2 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined2 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_9b0[0] = local_9a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b0,"WS2811","");
  local_990[0] = local_980;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_990,"Worldsemi 24-bit RGB controller","");
  local_970 = 0x308;
  local_968 = 0x3f0a36e2eb1c432c;
  uStack_960 = 0x3f0a36e2eb1c432c;
  local_958 = 0x3f0a36e2eb1c432c;
  uStack_950 = 0x3e977cf447651960;
  local_948 = 0x3ea0c6f7a0b5ed8e;
  uStack_940 = 0x3ea5cf751db94e6b;
  local_938 = 0x3ebf09b082ea2aac;
  uStack_930 = 0x3ec0c6f7a0b5ed8e;
  local_928 = 0x3ec20916fff6c5c5;
  uStack_920 = 0x3eb19db7358bd308;
  local_918 = 0x3eb421f5f40d8377;
  uStack_910 = 0x3eb6a634b28f33e5;
  local_908 = 0x3eb34b365f379dfc;
  uStack_900 = 0x3eb5cf751db94e6b;
  local_8f8 = 0x3eb853b3dc3afeda;
  local_8f0 = 1;
  local_8e8 = 0x3e877cf447651960;
  uStack_8e0 = 0x3e90c6f7a0b5ed8e;
  local_8d8 = 0x3e95cf751db94e6b;
  uStack_8d0 = 0x3eaf09b082ea2aac;
  local_8c8 = 0x3eb0c6f7a0b5ed8e;
  uStack_8c0 = 0x3eb20916fff6c5c5;
  local_8b8 = 0x3ea19db7358bd308;
  uStack_8b0 = 0x3ea421f5f40d8377;
  local_8a8 = 0x3ea6a634b28f33e5;
  uStack_8a0 = 0x3eb48d55be787634;
  local_898 = 0x1db94e6b;
  uStack_894 = 0x3eb5cf75;
  uStack_890 = 0x7cfa26a3;
  uStack_88c = 0x3eb71194;
  local_888 = 0;
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_880,"WS2812B","");
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,"Worldsemi 24-bit RGB integrated light-source","");
  local_840 = 0x308;
  local_838 = 0x3f0a36e2eb1c432c;
  uStack_830 = 0x3f0a36e2eb1c432c;
  local_828 = 0x3f0a36e2eb1c432c;
  uStack_820 = 0x3e8ad7f29abcaf49;
  local_818 = 0x3e9ad7f29abcaf49;
  uStack_810 = 0x3ea27476ca61b882;
  local_808 = 0x3ea77cf447651960;
  uStack_800 = 0x3eac8571c4687a3d;
  local_7f8 = 0x3eb19db7358bd308;
  uStack_7f0 = 0x3ea5cf751db94e6b;
  local_7e8 = 0x3eaad7f29abcaf49;
  uStack_7e0 = 0x3eb19db7358bd308;
  local_7d8 = 0x3e8ad7f29abcaf49;
  uStack_7d0 = 0x3e9e32f0ee144532;
  local_7c8 = 0x3ea421f5f40d8377;
  local_7c0 = 0;
  local_7b8 = 0;
  uStack_7b0 = 0;
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_798 = 0;
  uStack_790 = 0;
  local_788 = 0;
  uStack_780 = 0;
  local_778 = 0;
  uStack_770 = 0;
  local_768 = 0;
  uStack_760 = 0;
  local_758 = 1;
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"WS2813","");
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_730,"Worldsemi 24-bit RGB integrated light-source","");
  local_710 = 0x308;
  local_708 = 0x3f0a36e2eb1c432c;
  uStack_700 = 0x3f0a36e2eb1c432c;
  local_6f8 = 0x3f0a36e2eb1c432c;
  uStack_6f0 = 0x3e9421f5f40d8377;
  local_6e8 = 0x3e992a737110e454;
  uStack_6e0 = 0x3e9e32f0ee144532;
  local_6d8 = 0x3e9421f5f40d8377;
  uStack_6d0 = 0x3ead5c31593e5fb8;
  local_6c8 = 0x3f1a36e2eb1c432c;
  uStack_6c0 = 0x3ea92a737110e454;
  local_6b8 = 0x3ead5c31593e5fb8;
  uStack_6b0 = 0x3eb0c6f7a0b5ed8e;
  local_6a8 = 0x3e9421f5f40d8377;
  uStack_6a0 = 0x3e992a737110e454;
  local_698 = 0x3f1a36e2eb1c432c;
  local_690 = 0;
  local_688 = 0;
  uStack_680 = 0;
  local_678 = 0;
  uStack_670 = 0;
  local_668 = 0;
  uStack_660 = 0;
  local_658 = 0;
  uStack_650 = 0;
  local_648 = 0;
  uStack_640 = 0;
  local_638 = 0;
  uStack_630 = 0;
  local_628 = 1;
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"TM1809","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,"Titan Micro 9-chanel 24-bit RGB controller","");
  local_5e0 = 0x908;
  local_5d8 = 0x3ef92a737110e454;
  uStack_5d0 = 0x3ef92a737110e454;
  local_5c8 = 0x3ff0000000000000;
  uStack_5c0 = 0x3e9e32f0ee144532;
  local_5b8 = 0x3ea421f5f40d8377;
  uStack_5b0 = 0x3ea92a737110e454;
  local_5a8 = 0x3eb19db7358bd308;
  uStack_5a0 = 0x3eb421f5f40d8377;
  local_598 = 0x3eb6a634b28f33e5;
  uStack_590 = 0x3eb19db7358bd308;
  local_588 = 0x3eb421f5f40d8377;
  uStack_580 = 0x3eb6a634b28f33e5;
  local_578 = 0x3e9e32f0ee144532;
  uStack_570 = 0x3ea421f5f40d8377;
  local_568 = 0x3ea92a737110e454;
  local_560 = 1;
  local_558 = 0x3e90c6f7a0b5ed8e;
  uStack_550 = 0x3e95798ee2308c3a;
  local_548 = 0x3e9a2c2623ab2ae7;
  uStack_540 = 0x3ea1c8aa53503420;
  local_538 = 0x3ea421f5f40d8377;
  uStack_530 = 0x3ea67b4194cad2cd;
  local_528 = 0x3ea1c8aa53503420;
  uStack_520 = 0x3ea421f5f40d8377;
  local_518 = 0x3ea67b4194cad2cd;
  uStack_510 = 0x3e90c6f7a0b5ed8e;
  local_508 = 0xe2308c3a;
  uStack_504 = 0x3e95798e;
  uStack_500 = 0x23ab2ae7;
  uStack_4fc = 0x3e9a2c26;
  local_4f8 = 0;
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"TM1804","");
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d0,"Titan Micro 24-bit RGB controller","");
  local_4b0 = 0x308;
  local_4a8 = 0x3ee4f8b588e368f0;
  uStack_4a0 = 0x3ee4f8b588e368f0;
  local_498 = 0x3ff0000000000000;
  uStack_490 = 0x3eac8571c4687a3d;
  local_488 = 0x3eb0c6f7a0b5ed8d;
  uStack_480 = 0x3eb34b365f379dfc;
  local_478 = 0x3ebf09b082ea2aac;
  uStack_470 = 0x3ec0c6f7a0b5ed8d;
  local_468 = 0x3ec20916fff6c5c5;
  uStack_460 = 0x3ebf09b082ea2aac;
  local_458 = 0x3ec0c6f7a0b5ed8d;
  uStack_450 = 0x3ec20916fff6c5c5;
  local_448 = 0x3eac8571c4687a3d;
  uStack_440 = 0x3eb0c6f7a0b5ed8d;
  local_438 = 0x3eb34b365f379dfc;
  local_430 = 0;
  local_3c0[0] = local_3b0;
  local_428 = 0;
  uStack_420 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3c8 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"UCS1903","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a0,"UCS1903 24-bit RGB controller","");
  local_380 = 0x308;
  local_378 = 0x3ef92a737110e454;
  uStack_370 = 0x3ef92a737110e454;
  local_368 = 0x3ff0000000000000;
  uStack_360 = 0x3e977cf447651960;
  local_358 = 0x3ea0c6f7a0b5ed8e;
  uStack_350 = 0x3ea5cf751db94e6b;
  local_348 = 0x3ebf09b082ea2aac;
  uStack_340 = 0x3ec0c6f7a0b5ed8e;
  local_338 = 0x3ec20916fff6c5c5;
  uStack_330 = 0x3ebf09b082ea2aac;
  local_328 = 0x3ec0c6f7a0b5ed8e;
  uStack_320 = 0x3ec20916fff6c5c5;
  local_318 = 0x3e977cf447651960;
  uStack_310 = 0x3ea0c6f7a0b5ed8e;
  local_308 = 0x3ea5cf751db94e6b;
  local_300 = 1;
  local_2f8 = 0x3e877cf447651960;
  uStack_2f0 = 0x3e90c6f7a0b5ed8e;
  local_2e8 = 0x3e95cf751db94e6b;
  uStack_2e0 = 0x3eaf09b082ea2aac;
  local_2d8 = 0x3eb0c6f7a0b5ed8e;
  uStack_2d0 = 0x3eb20916fff6c5c5;
  local_2c8 = 0x3eaf09b082ea2aac;
  uStack_2c0 = 0x3eb0c6f7a0b5ed8e;
  local_2b8 = 0x3eb20916fff6c5c5;
  uStack_2b0 = 0x3e877cf447651960;
  local_2a8 = 0xa0b5ed8e;
  uStack_2a4 = 0x3e90c6f7;
  uStack_2a0 = 0x1db94e6b;
  uStack_29c = 0x3e95cf75;
  local_298 = 0;
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"LPD1886 - 24 bit","");
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_270,"LPD1886 RGB controller in 24-bit mode","");
  local_250 = 0x308;
  local_248 = 0x3ef92a737110e454;
  uStack_240 = 0x3eff75104d551d68;
  local_238 = 0x3ff0000000000000;
  uStack_230 = 0x3e8421f5f40d8377;
  local_228 = 0x3e8ad7f29abcaf49;
  uStack_220 = 0x3e92ca5d05ea7ab3;
  local_218 = 0x3ea0c6f7a0b5ed8e;
  uStack_210 = 0x3ea421f5f40d8377;
  local_208 = 0x3ee4f8b588e368f0;
  uStack_200 = 0x3e9e32f0ee144532;
  local_1f8 = 0x3ea421f5f40d8377;
  uStack_1f0 = 0x3ee2dfd694ccab3f;
  local_1e8 = 0x3e8421f5f40d8377;
  uStack_1e0 = 0x3e8ad7f29abcaf49;
  local_1d8 = 0x3ee4f8b588e368f0;
  local_1d0 = 0;
  local_160[0] = local_150;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_168 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"LPD1886 - 36 bit","");
  puVar2 = local_130;
  local_140[0] = puVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_140,"LPD1886 RGB controller in 36-bit mode","");
  local_120 = 0x30c;
  local_118 = 0x3ef92a737110e454;
  uStack_110 = 0x3eff75104d551d68;
  local_108 = 0x3ff0000000000000;
  uStack_100 = 0x3e8421f5f40d8377;
  local_f8 = 0x3e8ad7f29abcaf49;
  uStack_f0 = 0x3e92ca5d05ea7ab3;
  local_e8 = 0x3ea0c6f7a0b5ed8e;
  uStack_e0 = 0x3ea421f5f40d8377;
  local_d8 = 0x3ee4f8b588e368f0;
  uStack_d0 = 0x3e9e32f0ee144532;
  local_c8 = 0x3ea421f5f40d8377;
  uStack_c0 = 0x3ee2dfd694ccab3f;
  local_b8 = 0x3e8421f5f40d8377;
  uStack_b0 = 0x3e8ad7f29abcaf49;
  local_a8 = 0x3ee4f8b588e368f0;
  local_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::
  vector<AsyncRgbLedAnalyzerSettings::LedControllerData,std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>>
  ::_M_assign_aux<AsyncRgbLedAnalyzerSettings::LedControllerData_const*>
            ((vector<AsyncRgbLedAnalyzerSettings::LedControllerData,std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>>
              *)&this->mControllers,local_9b0);
  lVar1 = -0x980;
  do {
    if (puVar2 != *(undefined1 **)(puVar2 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar2 + -0x10));
    }
    if (puVar2 + -0x20 != *(undefined1 **)(puVar2 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar2 + -0x30));
    }
    puVar2 = puVar2 + -0x130;
    lVar1 = lVar1 + 0x130;
  } while (lVar1 != 0);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerSettings::InitControllerData()
{
    // order of values here must correspond to the Controller enum
    mControllers = {
        // name, description, bits per channel, channels per frame, reset time nsec, low-speed data nsec, has high speed, high speed data
        // nsec, color layout

        // https://cdn-shop.adafruit.com/datasheets/WS2811.pdf
        { "WS2811",
          "Worldsemi 24-bit RGB controller",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 350_ns, 500_ns, 650_ns }, { 1850_ns, 2000_ns, 2150_ns } },    // 0-bit times
              { { 1050_ns, 1200_ns, 1350_ns }, { 1150_ns, 1300_ns, 1450_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 175_ns, 250_ns, 325_ns }, { 925_ns, 1000_ns, 1075_ns } }, // 0-bit times
              { { 525_ns, 600_ns, 675_ns }, { 1225_ns, 1300_ns, 1375_ns } } // 1-bit times
          },
          LAYOUT_RGB },
        // https://cdn-shop.adafruit.com/datasheets/WS2812B.pdf
        // http://www.seeedstudio.com/document/pdf/WS2812B%20Datasheet.pdf
        { "WS2812B",
          "Worldsemi 24-bit RGB integrated light-source",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 200_ns, 400_ns, 550_ns }, { 700_ns, 850_ns, 1050_ns } }, // 0-bit times
              { { 650_ns, 800_ns, 1050_ns }, { 200_ns, 450_ns, 600_ns } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_GRB },

        // http://www.led-color.com/upload/201609/WS2813%20LED.pdf
        { "WS2813",
          "Worldsemi 24-bit RGB integrated light-source",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 300_ns, 375_ns, 450_ns }, { 300_ns, 875_ns, 100_us } },  // 0-bit times
              { { 750_ns, 875_ns, 1000_ns }, { 300_ns, 375_ns, 100_us } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_GRB },

        // https://www.deskontrol.net/descargas/datasheets/TM1809.pdf
        { "TM1809",
          "Titan Micro 9-chanel 24-bit RGB controller",
          8,
          9,
          { 24_us, 24_us, 1.0 },
          {
              // low-speed times
              { { 450_ns, 600_ns, 750_ns }, { 1050_ns, 1200_ns, 1350_ns } }, // 0-bit times
              { { 1050_ns, 1200_ns, 1350_ns }, { 450_ns, 600_ns, 750_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 250_ns, 320_ns, 390_ns }, { 530_ns, 600_ns, 670_ns } }, // 0-bit times
              { { 530_ns, 600_ns, 670_ns }, { 250_ns, 320_ns, 390_ns } }  // 1-bit times
          },
          LAYOUT_RGB },

        // https://www.deskontrol.net/descargas/datasheets/TM1804.pdf
        { "TM1804",
          "Titan Micro 24-bit RGB controller",
          8,
          3,
          { 10_us, 10_us, 1.0 },
          {
              // low-speed times
              { { 850_ns, 1_us, 1150_ns }, { 1850_ns, 2_us, 2150_ns } }, // 0-bit times
              { { 1850_ns, 2_us, 2150_ns }, { 850_ns, 1_us, 1150_ns } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },

        // http://www.bestlightingbuy.com/pdf/UCS1903%20datasheet.pdf
        { "UCS1903",
          "UCS1903 24-bit RGB controller",
          8,
          3,
          { 24_us, 24_us, 1.0 },
          {
              // low-speed times
              { { 350_ns, 500_ns, 650_ns }, { 1850_ns, 2000_ns, 2150_ns } }, // 0-bit times
              { { 1850_ns, 2000_ns, 2150_ns }, { 350_ns, 500_ns, 650_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 175_ns, 250_ns, 325_ns }, { 925_ns, 1000_ns, 1075_ns } }, // 0-bit times
              { { 925_ns, 1000_ns, 1075_ns }, { 175_ns, 250_ns, 325_ns } }  // 1-bit times
          },
          LAYOUT_RGB },

        // https://www.syncrolight.co.uk/datasheets/LPD1886%20datasheet.pdf
        { "LPD1886 - 24 bit",
          "LPD1886 RGB controller in 24-bit mode",
          8,
          3,
          { 24_us, 30_us, 1.0 },
          {
              // low-speed times
              { { 150_ns, 200_ns, 280_ns }, { 500_ns, 600_ns, 10_us } }, // 0-bit times
              { { 450_ns, 600_ns, 9_us }, { 150_ns, 200_ns, 10_us } },   // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },

        { "LPD1886 - 36 bit",
          "LPD1886 RGB controller in 36-bit mode",
          12,
          3,
          { 24_us, 30_us, 1.0 },
          {
              // low-speed times
              { { 150_ns, 200_ns, 280_ns }, { 500_ns, 600_ns, 10_us } }, // 0-bit times
              { { 450_ns, 600_ns, 9_us }, { 150_ns, 200_ns, 10_us } },   // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },
    };
}